

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  BaseEmitter *pBVar4;
  uint uVar5;
  byte bVar6;
  undefined8 uVar7;
  uint uVar8;
  Error EVar9;
  uint32_t uVar10;
  TypeId *pTVar11;
  ulong uVar12;
  InstId IVar13;
  Signature SVar14;
  undefined7 in_register_00000009;
  uint *puVar15;
  ulong extraout_RDX;
  ulong uVar16;
  uint uVar17;
  InstId instId;
  EmitHelper *this_00;
  int iVar18;
  uint uVar19;
  char *in_R9;
  int iVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  Operand_ OStack_80;
  Operand_ OStack_70;
  Operand dst;
  Operand src;
  
  puVar15 = (uint *)CONCAT71(in_register_00000009,typeId);
  if ((0xba < (byte)(typeId + ~_kVec512End)) && ((typeId & 0x7e) != _kBaseStart)) {
    dst.super_Operand_._signature._bits = (dst_->_signature)._bits;
    dst.super_Operand_._baseId = dst_->_baseId;
    dst.super_Operand_._data = *&dst_->_data;
    uVar7._0_4_ = (src_->_signature)._bits;
    uVar7._4_4_ = src_->_baseId;
    src.super_Operand_._data = *&src_->_data;
    bVar21 = (dst.super_Operand_._signature._bits & 7) == 2;
    if ((bool)bVar21) {
      src.super_Operand_._signature._bits._3_1_ = (byte)(uVar7._0_4_ >> 0x18);
      dst.super_Operand_._signature._bits =
           dst.super_Operand_._signature._bits & 0xfffffa |
           (uint)src.super_Operand_._signature._bits._3_1_ << 0x18;
    }
    src.super_Operand_._0_8_ = uVar7;
    if ((uVar7._0_4_ & 7) == 2) {
      bVar21 = bVar21 | 2;
      src.super_Operand_._baseId = uVar7._4_4_;
      src.super_Operand_._signature._bits =
           uVar7._0_4_ & 0xfffffa | (uint)dst.super_Operand_._signature._bits._3_1_ << 0x18;
    }
    uVar8 = 0;
    bVar22 = true;
    instId = 0x1b7;
    uVar19 = 0;
    switch(typeId) {
    case kInt8:
    case kUInt8:
    case kInt16:
    case kUInt16:
      if ((bVar21 & 2) == 0) {
        uVar19 = uVar8;
        if (bVar21 == 0) {
          dst.super_Operand_._signature._bits = 0x4000031;
          src.super_Operand_._signature._bits = 0x4000031;
        }
      }
      else {
        dst.super_Operand_._signature._bits = 0x4000031;
        instId = 0x1de;
        uVar19 = uVar8;
      }
      break;
    case kInt32:
    case kUInt32:
    case kInt64:
    case _kIntEnd:
      break;
    default:
      cVar1 = TypeUtils::_typeData[typeId];
      if (bVar21 == 0 || 9 < (byte)(typeId - _kVec32Start)) {
        if (9 < (byte)(typeId - _kVec64Start) || bVar21 == 0) {
          if (cVar1 == '+') {
            bVar23 = this->_avxEnabled == false;
            IVar13 = 0x4a8;
            instId = 0x1b9;
          }
          else if (cVar1 == '*') {
            bVar23 = this->_avxEnabled == false;
            IVar13 = 0x4a9;
            instId = 0x1ba;
          }
          else {
            instId = 0x4ad;
            uVar19 = uVar8;
            if (this->_avx512Enabled != false) break;
            bVar23 = this->_avxEnabled == false;
            IVar13 = 0x4ac;
            instId = 0x1c1;
          }
          uVar19 = 0;
          if (!bVar23) {
            uVar19 = uVar8;
            instId = IVar13;
          }
          break;
        }
        bVar22 = (this->_avxEnabled & 1U) != 0;
        IVar13 = 0x1d6;
        if (bVar22) {
          IVar13 = 0x4c1;
        }
        instId = 0x1d3;
        if (bVar22) {
          instId = 0x4c0;
        }
        if (cVar1 == '+') {
          instId = IVar13;
        }
        uVar19 = 0x8000000;
      }
      else {
        bVar22 = (this->_avxEnabled & 1U) != 0;
        IVar13 = 0x1d9;
        if (bVar22) {
          IVar13 = 0x4c5;
        }
        instId = 0x1bc;
        if (bVar22) {
          instId = 0x4aa;
        }
        if (cVar1 == '*') {
          instId = IVar13;
        }
        uVar19 = 0x4000000;
      }
      bVar22 = false;
      break;
    case _kMaskStart:
      instId = 0x165;
      uVar19 = uVar8;
      break;
    case kMask16:
      instId = 0x168;
      uVar19 = uVar8;
      break;
    case kMask32:
      instId = 0x166;
      uVar19 = uVar8;
      break;
    case _kMaskEnd:
      instId = 0x167;
      uVar19 = uVar8;
      break;
    case _kMmxStart:
      instId = 0x1bc;
      uVar19 = uVar8;
      if (bVar21 != 0) break;
    case _kMmxEnd:
      instId = 0x1d3;
      uVar19 = uVar8;
    }
    if (!bVar22) {
      if ((dst.super_Operand_._signature._bits & 7) == 2) {
        dst.super_Operand_._signature._bits =
             dst.super_Operand_._signature._bits & 0xfffffa | uVar19;
      }
      if ((src.super_Operand_._signature._bits & 7) == 2) {
        src.super_Operand_._signature._bits =
             src.super_Operand_._signature._bits & 0xfffffa | uVar19;
      }
    }
    pBVar4 = (this->super_BaseEmitHelper)._emitter;
    pBVar4->_inlineComment = comment;
    EVar9 = BaseEmitter::_emitI(pBVar4,instId,&dst.super_Operand_,&src.super_Operand_);
    return EVar9;
  }
  emitRegMove();
  bVar21 = (byte)comment;
  uVar16 = extraout_RDX;
  this_00 = this;
  if ((int)extraout_RDX == 0) {
    OStack_70._signature._bits._0_1_ = (byte)(dst_->_signature)._bits >> 3;
    this_00 = (EmitHelper *)
              (_archTraits +
              (ulong)(((this->super_BaseEmitHelper)._emitter)->_environment)._arch * 0xd8 + 0x94);
    pTVar11 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                        ((Array<asmjit::v1_14::TypeId,_32UL> *)this_00,(RegType *)&OStack_70);
    uVar16 = (ulong)*pTVar11;
  }
  iVar18 = (int)this_00;
  bVar6 = (byte)uVar16;
  if (((byte)(bVar6 + 0x9b) < 0xbb) || ((bVar6 & 0x7e) == 0x20)) {
    emitArgMove();
LAB_00143863:
    emitArgMove();
    EVar9 = 0;
    if (iVar18 - 1U < 8) {
      EVar9 = *(Error *)(&DAT_001593f0 + (ulong)(iVar18 - 1U) * 4);
    }
    return EVar9;
  }
  if (((byte)(bVar21 + 0x9b) < 0xbb) || ((bVar21 & 0x7e) == 0x20)) goto LAB_00143863;
  uVar16 = uVar16 & 0xff;
  uVar12 = (ulong)comment & 0xff;
  OStack_70._signature._bits = (dst_->_signature)._bits;
  OStack_70._baseId = dst_->_baseId;
  OStack_70._data = *&dst_->_data;
  OStack_80._signature._bits = puVar15[0];
  OStack_80._baseId = puVar15[1];
  OStack_80._data = *(uint32_t (*) [2])(puVar15 + 2);
  bVar2 = TypeUtils::_typeData[uVar16 + 0x100];
  bVar3 = TypeUtils::_typeData[uVar12 + 0x100];
  uVar8 = (uint)bVar3;
  uVar19 = 0;
  uVar17 = (uint)bVar3;
  if ((byte)(bVar6 - 0x20) < 10) {
    uVar19 = 0;
    if ((byte)(bVar21 - 0x20) < 10) {
      iVar18 = (int)uVar16 * 0x100;
      iVar20 = iVar18 + (int)uVar12;
      uVar19 = (iVar18 + (int)uVar12) - 0x2822;
      if ((((uVar19 < 5) && ((0x15U >> (uVar19 & 0x1f) & 1) != 0)) || (iVar20 == 0x2422)) ||
         ((iVar20 == 0x2624 || (iVar20 == 0x2622)))) {
        uVar19 = iVar20 == 0x2826 | 0x1da;
        OStack_70._signature._bits = *(uint32_t *)(regSizeToGpSignature + (ulong)bVar2 * 4);
        if ((OStack_80._signature._bits & 7) == 1) {
          OStack_80._signature._bits = *(uint32_t *)(regSizeToGpSignature + (ulong)bVar3 * 4);
        }
        bVar22 = false;
      }
      else {
        bVar22 = true;
        uVar19 = 0;
      }
      if (!bVar22) goto LAB_00143816;
    }
    if (((byte)(bVar21 - 0x20) < 10) || ((*puVar15 & 7) == 2)) {
      bVar21 = bVar2;
      if (bVar3 <= bVar2) {
        bVar21 = bVar3;
      }
      uVar19 = 0x1b7;
      if (bVar21 < 4) {
        uVar19 = 0x1de;
      }
      uVar16 = (ulong)bVar21;
      if (bVar3 <= bVar2) {
        uVar16 = (ulong)bVar3;
      }
      uVar8 = (uint)uVar16;
      uVar12 = 4;
      if (4 < bVar21) {
        uVar12 = (ulong)bVar2;
      }
      OStack_70._signature._bits = *(uint32_t *)(regSizeToGpSignature + uVar12 * 4);
      if ((OStack_80._signature._bits & 7) == 1) {
        OStack_80._signature._bits = *(uint32_t *)(regSizeToGpSignature + uVar16 * 4);
      }
      goto LAB_00143816;
    }
    if ((uint)bVar2 < (uint)bVar3) {
      bVar3 = bVar2;
    }
    uVar8 = (uint)bVar3;
    if ((byte)(bVar21 - 0x31) < 2) {
      uVar19 = 0x1d3;
      if (uVar8 != 8) {
        OStack_70._signature._bits = 0x4000031;
        uVar19 = 0x1bc;
      }
      goto LAB_00143816;
    }
    if ((byte)(bVar21 - 0x2d) < 4) {
      uVar19 = kmovInstFromSize(uVar8);
      SVar14._bits = 0x8000039;
      if (uVar8 < 5) {
        SVar14._bits = 0x4000031;
      }
      OStack_70._signature._bits = SVar14._bits;
      goto LAB_00143816;
    }
    uVar17 = uVar8;
    if ((byte)(bVar21 - 0x33) < 0x32) {
      uVar19 = 0x1d3;
      if (this->_avxEnabled != false) {
        uVar19 = 0x4c0;
      }
      if (uVar8 != 8) {
        uVar19 = 0x1bc;
        if (this->_avxEnabled != false) {
          uVar19 = 0x4aa;
        }
        OStack_70._signature._bits = 0x4000031;
      }
      goto LAB_00143816;
    }
  }
  uVar8 = uVar17;
  uVar17 = (uint)bVar2;
  if ((byte)(bVar6 - 0x31) < 2) {
    if (uVar17 <= uVar8) {
      uVar8 = uVar17;
    }
    if ((9 < (byte)(bVar21 - 0x20)) && ((OStack_80._signature._bits & 7) != 2)) {
      uVar19 = 0x1d3;
      if (((byte)(bVar21 - 0x31) < 2) || (uVar19 = 0x1c0, (byte)(bVar21 - 0x33) < 0x32))
      goto LAB_00143816;
      goto LAB_00143553;
    }
    uVar19 = 0x1d3;
    if ((uVar8 == 8) || (uVar19 = 0x1bc, (OStack_80._signature._bits & 7) != 1)) goto LAB_00143816;
LAB_001435b7:
    OStack_80._signature._bits = 0x4000031;
    goto LAB_00143816;
  }
LAB_00143553:
  if ((byte)(bVar6 - 0x2d) < 4) {
    if (uVar17 <= uVar8) {
      uVar8 = uVar17;
    }
    if (((byte)(bVar21 - 0x2d) < 4 || (byte)(bVar21 - 0x20) < 10) ||
       ((OStack_80._signature._bits & 7) == 2)) {
      uVar19 = kmovInstFromSize(uVar8);
      if (((OStack_80._signature._bits & 0xf07) != 1) || (4 < uVar8)) goto LAB_00143816;
      goto LAB_001435b7;
    }
  }
  if (0x31 < (byte)(bVar6 - 0x33)) {
    return 3;
  }
  OStack_70._signature._bits = 0x10000161;
  if ((OStack_80._signature._bits & 0xff000fff) == 0x8000391) {
    uVar19 = 0x1d4;
    goto LAB_00143816;
  }
  if (TypeUtils::_typeData[uVar12] == '+' && TypeUtils::_typeData[uVar16] == '*') {
    uVar19 = (uint)bVar2 * 2;
    if (uVar8 < uVar19) {
      uVar19 = uVar8;
    }
    uVar8 = uVar19;
    bVar22 = (this->_avxEnabled & 1U) != 0;
    uVar17 = 0x9b;
    if (bVar22) {
      uVar17 = 0x3a4;
    }
    uVar19 = 0x95;
    if (bVar22) {
      uVar19 = 0x390;
    }
    if (uVar8 < 9) {
      uVar19 = uVar17;
    }
    if ((uVar8 & 0xfe) == 0x40) {
      OStack_70._signature._bits = 0x20000169;
    }
    if ((OStack_80._signature._bits & 7) != 1) goto LAB_0014380d;
    uVar10 = 0x40000171;
    if (uVar8 < 0x21) {
      uVar10 = 0x20000169;
    }
    SVar14._bits = 0x10000161;
    if (0x10 < uVar8) {
      SVar14._bits = uVar10;
    }
LAB_00143678:
    OStack_80._signature._bits = SVar14._bits;
LAB_0014380d:
    bVar22 = false;
  }
  else {
    if (TypeUtils::_typeData[uVar12] != '*' || TypeUtils::_typeData[uVar16] != '+') {
      if (uVar8 < uVar17) {
        uVar17 = uVar8;
      }
      uVar8 = uVar17;
      if ((OStack_80._signature._bits & 0xf07) == 1 || (OStack_80._signature._bits & 7) == 2) {
        if (uVar8 < 5) {
          uVar19 = 0x1bc;
          if (this->_avxEnabled != false) {
            uVar19 = 0x4aa;
          }
          if ((OStack_80._signature._bits & 3) == 1) {
            OStack_80._signature._bits = 0x4000031;
          }
        }
        else {
          if (uVar8 != 8) goto LAB_00143786;
          uVar19 = 0x1d3;
          if (this->_avxEnabled != false) {
            uVar19 = 0x4c0;
          }
        }
      }
      else {
LAB_00143786:
        bVar22 = true;
        if ((OStack_80._signature._bits & 0xf07) != 0x101 && (OStack_80._signature._bits & 7) != 2)
        goto LAB_0014380f;
        uVar19 = 0x1ba;
        if (this->_avxEnabled != false) {
          uVar19 = 0x4a9;
        }
        if ((((OStack_80._signature._bits & 3) == 2) &&
            (uVar10 = Environment::stackAlignment
                                (&((this->super_BaseEmitHelper)._emitter)->_environment),
            uVar8 < uVar10)) && (uVar19 = 0x1dd, this->_avxEnabled != false)) {
          uVar19 = 0x4c7;
        }
        uVar10 = 0x40000171;
        if (uVar8 < 0x21) {
          uVar10 = 0x20000169;
        }
        SVar14._bits = 0x10000161;
        if (0x10 < uVar8) {
          SVar14._bits = uVar10;
        }
        OStack_70._signature._bits = SVar14._bits;
        if ((OStack_80._signature._bits & 7) == 1) goto LAB_00143678;
      }
      goto LAB_0014380d;
    }
    uVar5 = uVar8 * 2;
    if (uVar17 <= uVar8 * 2) {
      uVar5 = uVar17;
    }
    uVar8 = uVar5 >> 1;
    bVar22 = (this->_avxEnabled & 1U) != 0;
    uVar17 = 0x98;
    if (bVar22) {
      uVar17 = 0x39b;
    }
    uVar19 = 0x91;
    if (bVar22) {
      uVar19 = 0x382;
    }
    if (uVar5 < 10) {
      uVar19 = uVar17;
    }
    uVar10 = 0x40000171;
    if ((uVar5 & 0xfe) < 0x21) {
      uVar10 = 0x20000169;
    }
    OStack_70._signature._bits = 0x10000161;
    if (0x10 < (uVar5 & 0xfe)) {
      OStack_70._signature._bits = uVar10;
    }
    bVar22 = false;
    if (((OStack_80._signature._bits & 7) == 1) && (0x3f < uVar5)) {
      OStack_80._signature._bits = 0x20000169;
      goto LAB_0014380d;
    }
  }
LAB_0014380f:
  if (bVar22) {
    return 3;
  }
LAB_00143816:
  if ((OStack_80._signature._bits & 7) == 2) {
    OStack_80._signature._bits = OStack_80._signature._bits & 0xfffffa | uVar8 << 0x18;
  }
  pBVar4 = (this->super_BaseEmitHelper)._emitter;
  pBVar4->_inlineComment = in_R9;
  EVar9 = BaseEmitter::_emitI(pBVar4,uVar19,&OStack_70,&OStack_80);
  return EVar9;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.as<Mem>().size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.as<Mem>().size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}